

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O0

void mbedtls_ripemd160(uchar *input,size_t ilen,uchar *output)

{
  undefined1 local_7c [8];
  mbedtls_ripemd160_context ctx;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx.buffer._56_8_ = output;
  mbedtls_ripemd160_init((mbedtls_ripemd160_context *)local_7c);
  mbedtls_ripemd160_starts((mbedtls_ripemd160_context *)local_7c);
  mbedtls_ripemd160_update((mbedtls_ripemd160_context *)local_7c,input,ilen);
  mbedtls_ripemd160_finish((mbedtls_ripemd160_context *)local_7c,(uchar *)ctx.buffer._56_8_);
  mbedtls_ripemd160_free((mbedtls_ripemd160_context *)local_7c);
  return;
}

Assistant:

void mbedtls_ripemd160( const unsigned char *input, size_t ilen,
                unsigned char output[20] )
{
    mbedtls_ripemd160_context ctx;

    mbedtls_ripemd160_init( &ctx );
    mbedtls_ripemd160_starts( &ctx );
    mbedtls_ripemd160_update( &ctx, input, ilen );
    mbedtls_ripemd160_finish( &ctx, output );
    mbedtls_ripemd160_free( &ctx );
}